

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

uint8_t cpuid2_cache_descriptor(CPUCacheInfo *cache)

{
  ulong in_RAX;
  int *piVar1;
  ulong uVar2;
  bool bVar3;
  
  if (cache->size == 0) {
    __assert_fail("cache->size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbc,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->level == 0) {
    __assert_fail("cache->level > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbd,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->line_size == 0) {
    __assert_fail("cache->line_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xbe,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
  }
  if (cache->associativity != 0) {
    piVar1 = &cpuid2_cache_descriptors[0].associativity;
    uVar2 = 0;
    while( true ) {
      bVar3 = true;
      if ((((piVar1[-3] == (uint)cache->level) &&
           (((CPUID2CacheDescriptorInfo *)(piVar1 + -4))->type == cache->type)) &&
          (piVar1[-2] == cache->size)) && (piVar1[-1] == (uint)cache->line_size)) {
        bVar3 = *piVar1 != (uint)cache->associativity;
        in_RAX = in_RAX & 0xff;
        if (!bVar3) {
          in_RAX = uVar2 & 0xffffffff;
        }
      }
      if (!bVar3) break;
      uVar2 = uVar2 + 1;
      piVar1 = piVar1 + 5;
      if (uVar2 == 0xed) {
        return 0xff;
      }
    }
    return (uint8_t)in_RAX;
  }
  __assert_fail("cache->associativity > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                ,0xbf,"uint8_t cpuid2_cache_descriptor(CPUCacheInfo *)");
}

Assistant:

static uint8_t cpuid2_cache_descriptor(CPUCacheInfo *cache)
{
    int i;

    assert(cache->size > 0);
    assert(cache->level > 0);
    assert(cache->line_size > 0);
    assert(cache->associativity > 0);
    for (i = 0; i < ARRAY_SIZE(cpuid2_cache_descriptors); i++) {
        struct CPUID2CacheDescriptorInfo *d = &cpuid2_cache_descriptors[i];
        if (d->level == cache->level && d->type == cache->type &&
            d->size == cache->size && d->line_size == cache->line_size &&
            d->associativity == cache->associativity) {
                return i;
            }
    }

    return CACHE_DESCRIPTOR_UNAVAILABLE;
}